

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  pointer pMVar1;
  ostream *poVar2;
  string *_str;
  TextAttributes local_a8;
  Text local_88;
  
  if ((this->messageLabel)._M_string_length != 0) {
    poVar2 = std::operator<<(this->stream,(string *)&this->messageLabel);
    poVar2 = std::operator<<(poVar2,":");
    std::operator<<(poVar2,"\n");
  }
  pMVar1 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (_str = &((this->messages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start)->message; (pointer)&_str[-3].field_2 != pMVar1;
      _str = (string *)((long)&_str[3].field_2 + 8)) {
    if ((this->printInfoMessages != false) || (*(int *)((long)&_str[-1].field_2 + 8) != 1)) {
      poVar2 = this->stream;
      local_a8.initialIndent = 0xffffffffffffffff;
      local_a8.width = 0x4f;
      local_a8.tabChar = '\t';
      local_a8.indent = 2;
      Tbc::Text::Text(&local_88,_str,&local_a8);
      poVar2 = Tbc::operator<<(poVar2,&local_88);
      std::operator<<(poVar2,"\n");
      Tbc::Text::~Text(&local_88);
    }
  }
  return;
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ":" << "\n";
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || it->type != ResultWas::Info )
                        stream << Text( it->message, TextAttributes().setIndent(2) ) << "\n";
                }
            }